

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBoxPrivate::updateLineEditGeometry(QComboBoxPrivate *this)

{
  QStyleOptionComboBox *this_00;
  QWidget *this_01;
  char cVar1;
  LayoutDirection direction;
  QStyle *pQVar2;
  QSize QVar3;
  long in_FS_OFFSET;
  QRect QVar4;
  QStyleOptionComboBox opt;
  QSize local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  QStyleOptionComboBox local_c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->lineEdit != (QLineEdit *)0x0) {
    this_01 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    this_00 = (QStyleOptionComboBox *)(local_d8 + 0x10);
    memset(this_00,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox(this_00);
    (**(code **)(*(long *)this_01 + 0x1b8))(this_01,this_00);
    pQVar2 = QWidget::style(this_01);
    QVar4 = (QRect)(**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2,1,this_00,2,this_01);
    local_d8 = (undefined1  [16])QVar4;
    cVar1 = QPersistentModelIndex::isValid();
    if (cVar1 != '\0') {
      QPersistentModelIndex::row();
      QComboBox::itemIcon((QComboBox *)local_e8,(int)this_01);
      cVar1 = QIcon::isNull();
      QIcon::~QIcon((QIcon *)local_e8);
      if (cVar1 == '\0') {
        local_e8._0_8_ = local_d8._0_8_;
        local_e8._8_8_ = local_d8._8_8_;
        QVar3 = QComboBox::iconSize((QComboBox *)this_01);
        direction = QWidget::layoutDirection(this_01);
        local_f0.wd.m_i = (QVar4.x2.m_i.m_i - (QVar3.wd.m_i.m_i + QVar4.x1.m_i.m_i)) + -3;
        local_f0.ht.m_i = (QVar4.y2.m_i.m_i - QVar4.y1.m_i) + 1;
        local_d8 = (undefined1  [16])
                   QStyle::alignedRect(direction,(Alignment)0x2,&local_f0,(QRect *)local_e8);
      }
    }
    QWidget::setGeometry(&this->lineEdit->super_QWidget,(QRect *)local_d8);
    QIcon::~QIcon(&local_c8.currentIcon);
    if (&(local_c8.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_c8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_c8.currentText.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)(local_d8 + 0x10));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::updateLineEditGeometry()
{
    if (!lineEdit)
        return;

    Q_Q(QComboBox);
    QStyleOptionComboBox opt;
    q->initStyleOption(&opt);
    QRect editRect = q->style()->subControlRect(QStyle::CC_ComboBox, &opt,
                                                QStyle::SC_ComboBoxEditField, q);
    if (currentIndex.isValid() && !q->itemIcon(q->currentIndex()).isNull()) {
        QRect comboRect(editRect);
        editRect.setWidth(editRect.width() - q->iconSize().width() - 4);
        editRect = QStyle::alignedRect(q->layoutDirection(), Qt::AlignRight,
                                       editRect.size(), comboRect);
    }
    lineEdit->setGeometry(editRect);
}